

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void PeleLM::Initialize_specific(void)

{
  unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
  uVar1;
  Factory<pele::physics::reactions::ReactorBase> FVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  int *piVar6;
  int *piVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  value_type_conflict *__val;
  int dir;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lo_bc_char;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hi_bc_char;
  ParmParse pplm;
  Factory<pele::physics::reactions::ReactorBase> local_c8;
  string local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  ParmParse local_88;
  
  (anonymous_namespace)::num_deltaT_iters_MAX = 10;
  (anonymous_namespace)::deltaT_norm_max = 0x3ddb7cdfd9d7bdbb;
  (anonymous_namespace)::num_forkjoin_tasks = 1;
  (anonymous_namespace)::forkjoin_verbose = 0;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"peleLM","");
  amrex::ParmParse::ParmParse(&local_88,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  amrex::ParmParse::query(&local_88,"speciesGroupSize",&nSpecGroup,0);
  amrex::ParmParse::query
            (&local_88,"num_forkjoin_tasks",&(anonymous_namespace)::num_forkjoin_tasks,0);
  amrex::ParmParse::query
            (&local_88,"forkjoin_verbose",(bool *)&(anonymous_namespace)::forkjoin_verbose,0);
  amrex::ParmParse::query
            (&local_88,"num_deltaT_iters_MAX",&(anonymous_namespace)::num_deltaT_iters_MAX,0);
  amrex::ParmParse::query
            (&local_88,"deltaT_norm_max",(double *)&(anonymous_namespace)::deltaT_norm_max,0);
  amrex::ParmParse::query(&local_88,"deltaT_verbose",&deltaT_verbose,0);
  amrex::ParmParse::query(&local_88,"deltaT_crashOnConvFail",&deltaT_crashOnConvFail,0);
  amrex::ParmParse::query(&local_88,"use_typ_vals_chem",&use_typ_vals_chem,0);
  amrex::ParmParse::query(&local_88,"harm_avg_cen2edge",&def_harm_avg_cen2edge,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_c0,3,(allocator_type *)&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,3,(allocator_type *)&local_c8);
  amrex::ParmParse::getarr
            (&local_88,"lo_bc",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c0,0,3);
  amrex::ParmParse::getarr(&local_88,"hi_bc",&local_a0,0,3);
  piVar6 = (int *)operator_new(0xc);
  *piVar6 = 0;
  piVar6[1] = 0;
  piVar6[2] = 0;
  piVar7 = (int *)operator_new(0xc);
  *piVar7 = 0;
  piVar7[1] = 0;
  piVar7[2] = 0;
  lVar9 = 0;
  lVar10 = 0;
  bVar11 = 0;
  do {
    iVar4 = std::__cxx11::string::compare(local_c0._M_dataplus._M_p + lVar9);
    if (iVar4 == 0) {
      uVar5 = 0;
LAB_00266344:
      *(undefined4 *)((long)piVar6 + lVar10) = uVar5;
    }
    else {
      iVar4 = std::__cxx11::string::compare(local_c0._M_dataplus._M_p + lVar9);
      if (iVar4 == 0) {
        uVar5 = 1;
        bVar11 = 1;
        goto LAB_00266344;
      }
      iVar4 = std::__cxx11::string::compare(local_c0._M_dataplus._M_p + lVar9);
      if (iVar4 == 0) {
        uVar5 = 2;
        bVar11 = 1;
        goto LAB_00266344;
      }
      iVar4 = std::__cxx11::string::compare(local_c0._M_dataplus._M_p + lVar9);
      if (iVar4 == 0) {
        uVar5 = 3;
        goto LAB_00266344;
      }
      iVar4 = std::__cxx11::string::compare(local_c0._M_dataplus._M_p + lVar9);
      if (iVar4 == 0) {
        uVar5 = 4;
        goto LAB_00266344;
      }
      iVar4 = std::__cxx11::string::compare(local_c0._M_dataplus._M_p + lVar9);
      if (iVar4 == 0) {
        uVar5 = 5;
        goto LAB_00266344;
      }
      iVar4 = std::__cxx11::string::compare(local_c0._M_dataplus._M_p + lVar9);
      if (iVar4 == 0) {
        uVar5 = 6;
        goto LAB_00266344;
      }
      iVar4 = std::__cxx11::string::compare(local_c0._M_dataplus._M_p + lVar9);
      if (iVar4 == 0) {
        uVar5 = 7;
        goto LAB_00266344;
      }
      amrex::Abort_host(
                       "Wrong boundary condition word in lo_bc, please use: Interior, Inflow, Outflow, Symmetry, SlipWallAdiab, NoSlipWallAdiab, SlipWallIsotherm, NoSlipWallIsotherm"
                       );
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((long)&((local_a0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar9));
    if (iVar4 == 0) {
      uVar5 = 0;
      goto LAB_0026644d;
    }
    iVar4 = std::__cxx11::string::compare
                      ((char *)((long)&((local_a0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar9));
    if (iVar4 == 0) {
      uVar5 = 1;
LAB_0026644a:
      bVar11 = 1;
LAB_0026644d:
      *(undefined4 *)((long)piVar7 + lVar10) = uVar5;
    }
    else {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((local_a0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar9));
      if (iVar4 == 0) {
        uVar5 = 2;
        goto LAB_0026644a;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((local_a0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar9));
      if (iVar4 == 0) {
        uVar5 = 3;
        goto LAB_0026644d;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((local_a0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar9));
      if (iVar4 == 0) {
        uVar5 = 4;
        goto LAB_0026644d;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((local_a0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar9));
      if (iVar4 == 0) {
        uVar5 = 5;
        goto LAB_0026644d;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((local_a0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar9));
      if (iVar4 == 0) {
        uVar5 = 6;
        goto LAB_0026644d;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&((local_a0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar9));
      if (iVar4 == 0) {
        uVar5 = 7;
        goto LAB_0026644d;
      }
      amrex::Abort_host(
                       "Wrong boundary condition word in hi_bc, please use: Interior, UserBC, Symmetry, SlipWall, NoSlipWall"
                       );
    }
    lVar10 = lVar10 + 4;
    lVar9 = lVar9 + 0x20;
    if (lVar9 == 0x60) {
      NavierStokesBase::phys_bc.bc[2] = piVar6[2];
      NavierStokesBase::phys_bc.bc._0_8_ = *(undefined8 *)piVar6;
      NavierStokesBase::phys_bc.bc._12_8_ = *(undefined8 *)piVar7;
      NavierStokesBase::phys_bc.bc[5] = piVar7[2];
      NavierStokesBase::read_geometry();
      lVar9 = **(long **)(DAT_00816538 + -8);
      if (((*(char *)(lVar9 + 0x51) != '\0') || (*(char *)(lVar9 + 0x52) != '\0')) ||
         (*(char *)(lVar9 + 0x53) == '\x01')) {
        lVar9 = 0;
        do {
          if (*(char *)(**(long **)(DAT_00816538 + -8) + 0x51 + lVar9) == '\x01') {
            if (piVar6[lVar9] != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"PeleLM::variableSetUp:periodic in direction ",0x2c);
              poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,(int)lVar9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," but low BC is not Interior\n",0x1c);
              amrex::Abort_host("PeleLM::Initialize()");
            }
            if (piVar7[lVar9] != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"PeleLM::variableSetUp:periodic in direction ",0x2c);
              poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,(int)lVar9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," but high BC is not Interior\n",0x1d);
              amrex::Abort_host("PeleLM::Initialize()");
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      lVar9 = 0;
      do {
        if (*(char *)(**(long **)(DAT_00816538 + -8) + 0x51 + lVar9) == '\0') {
          if (piVar6[lVar9] == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"PeleLM::variableSetUp:Interior bc in direction ",0x2f)
            ;
            poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,(int)lVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," but not defined as periodic\n",0x1d);
            amrex::Abort_host("PeleLM::Initialize()");
          }
          if (piVar7[lVar9] == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"PeleLM::variableSetUp:Interior bc in direction ",0x2f)
            ;
            poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,(int)lVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," but not defined as periodic\n",0x1d);
            amrex::Abort_host("PeleLM::Initialize()");
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      closed_chamber = (int)(~bVar11 & 1);
      dpdt_factor = 1.0;
      amrex::ParmParse::query(&local_88,"dpdt_factor",&dpdt_factor,0);
      bVar3 = amrex::ParmParse::contains(&local_88,"chem_integrator");
      if (!bVar3) {
        amrex::Abort_host("  peleLM.chem_integrator need to be specified");
      }
      amrex::ParmParse::get(&local_88,"chem_integrator",&chem_integrator_abi_cxx11_,0);
      pele::physics::Factory<pele::physics::reactions::ReactorBase>::create
                (&local_c8,&chem_integrator_abi_cxx11_);
      FVar2._vptr_Factory = local_c8._vptr_Factory;
      uVar1 = m_reactor;
      local_c8._vptr_Factory = (_func_int **)0x0;
      m_reactor._M_t.
      super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
      .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>,_true,_true>
            )(__uniq_ptr_data<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>,_true,_true>
              )FVar2._vptr_Factory;
      if (((__uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
            )uVar1._M_t.
             super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
             .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
            )0x0) &&
         ((**(code **)(*(long *)uVar1._M_t.
                                super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                                .
                                super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>
                                ._M_head_impl + 8))(), local_c8._vptr_Factory != (_func_int **)0x0))
      {
        (**(code **)(*local_c8._vptr_Factory + 8))();
      }
      (**(code **)(*(long *)m_reactor._M_t.
                            super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                            .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>.
                            _M_head_impl + 0x10))
                (m_reactor._M_t.
                 super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                 .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>._M_head_impl
                 ,2,1);
      operator_delete(piVar7,0xc);
      operator_delete(piVar6,0xc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_c0);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88);
      return;
    }
  } while( true );
}

Assistant:

void
PeleLM::Initialize_specific ()
{

    num_deltaT_iters_MAX    = 10;
    deltaT_norm_max         = 1.e-10;
    num_forkjoin_tasks      = 1;
    forkjoin_verbose        = false;

    ParmParse pplm("peleLM");

    // Number of species in group for multi-component solves
    pplm.query("speciesGroupSize",nSpecGroup);

    pplm.query("num_forkjoin_tasks",num_forkjoin_tasks);
    pplm.query("forkjoin_verbose",forkjoin_verbose);
    pplm.query("num_deltaT_iters_MAX",num_deltaT_iters_MAX);
    pplm.query("deltaT_norm_max",deltaT_norm_max);
    pplm.query("deltaT_verbose",deltaT_verbose);
    pplm.query("deltaT_crashOnConvFail",deltaT_crashOnConvFail);

    pplm.query("use_typ_vals_chem",use_typ_vals_chem);
    pplm.query("harm_avg_cen2edge", def_harm_avg_cen2edge);

    // Get boundary conditions
    Vector<std::string> lo_bc_char(AMREX_SPACEDIM);
    Vector<std::string> hi_bc_char(AMREX_SPACEDIM);
    pplm.getarr("lo_bc",lo_bc_char,0,AMREX_SPACEDIM);
    pplm.getarr("hi_bc",hi_bc_char,0,AMREX_SPACEDIM);


    Vector<int> lo_bc(AMREX_SPACEDIM), hi_bc(AMREX_SPACEDIM);
    bool flag_closed_chamber = false;
    for (int dir = 0; dir<AMREX_SPACEDIM; dir++){
      if (!lo_bc_char[dir].compare("Interior")){
        lo_bc[dir] = 0;
      } else if (!lo_bc_char[dir].compare("Inflow")){
        lo_bc[dir] = 1;
        flag_closed_chamber = true;
      } else if (!lo_bc_char[dir].compare("Outflow")){
        lo_bc[dir] = 2;
        flag_closed_chamber = true;
      } else if (!lo_bc_char[dir].compare("Symmetry")){
        lo_bc[dir] = 3;
      } else if (!lo_bc_char[dir].compare("SlipWallAdiab")){
        lo_bc[dir] = 4;
      } else if (!lo_bc_char[dir].compare("NoSlipWallAdiab")){
        lo_bc[dir] = 5;
      } else if (!lo_bc_char[dir].compare("SlipWallIsotherm")){
        lo_bc[dir] = 6;
      } else if (!lo_bc_char[dir].compare("NoSlipWallIsotherm")){
        lo_bc[dir] = 7;
      } else {
        amrex::Abort("Wrong boundary condition word in lo_bc, please use: Interior, Inflow, Outflow, "
                     "Symmetry, SlipWallAdiab, NoSlipWallAdiab, SlipWallIsotherm, NoSlipWallIsotherm");
      }

      if (!hi_bc_char[dir].compare("Interior")){
        hi_bc[dir] = 0;
      } else if (!hi_bc_char[dir].compare("Inflow")){
        hi_bc[dir] = 1;
        flag_closed_chamber = true;
      } else if (!hi_bc_char[dir].compare("Outflow")){
        hi_bc[dir] = 2;
        flag_closed_chamber = true;
      } else if (!hi_bc_char[dir].compare("Symmetry")){
        hi_bc[dir] = 3;
      } else if (!hi_bc_char[dir].compare("SlipWallAdiab")){
        hi_bc[dir] = 4;
      } else if (!hi_bc_char[dir].compare("NoSlipWallAdiab")){
        hi_bc[dir] = 5;
      } else if (!hi_bc_char[dir].compare("SlipWallIsotherm")){
        hi_bc[dir] = 6;
      } else if (!hi_bc_char[dir].compare("NoSlipWallIsotherm")){
        hi_bc[dir] = 7;
      } else {
        amrex::Abort("Wrong boundary condition word in hi_bc, please use: Interior, UserBC, Symmetry, SlipWall, NoSlipWall");
      }
    }

    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        phys_bc.setLo(i,lo_bc[i]);
        phys_bc.setHi(i,hi_bc[i]);
    }

    read_geometry();
    //
    // Check phys_bc against possible periodic geometry
    // if periodic, must have internal BC marked.
    //
    if (DefaultGeometry().isAnyPeriodic())
    {
        //
        // Do idiot check.  Periodic means interior in those directions.
        //
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
        {
            if (DefaultGeometry().isPeriodic(dir))
            {
                if (lo_bc[dir] != Interior)
                {
                    std::cerr << "PeleLM::variableSetUp:periodic in direction "
                              << dir
                              << " but low BC is not Interior\n";
                    amrex::Abort("PeleLM::Initialize()");
                }
                if (hi_bc[dir] != Interior)
                {
                    std::cerr << "PeleLM::variableSetUp:periodic in direction "
                              << dir
                              << " but high BC is not Interior\n";
                    amrex::Abort("PeleLM::Initialize()");
                }
            }
        }
    }

    {
        //
        // Do idiot check.  If not periodic, should be no interior.
        //
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
        {
            if (!DefaultGeometry().isPeriodic(dir))
            {
              if (lo_bc[dir] == Interior)
              {
                  std::cerr << "PeleLM::variableSetUp:Interior bc in direction "
                            << dir
                            << " but not defined as periodic\n";
                  amrex::Abort("PeleLM::Initialize()");
              }
              if (hi_bc[dir] == Interior)
              {
                  std::cerr << "PeleLM::variableSetUp:Interior bc in direction "
                            << dir
                            << " but not defined as periodic\n";
                  amrex::Abort("PeleLM::Initialize()");
              }
            }
        }
    }

   PeleLM::closed_chamber  = 1;
   if (flag_closed_chamber){
      PeleLM::closed_chamber  = 0;
   }

   PeleLM::dpdt_factor = 1.0;
   pplm.query("dpdt_factor",dpdt_factor);

   // Initialize reactor: TODO might do a per level ?
   if (!pplm.contains("chem_integrator")) {
      Abort("  peleLM.chem_integrator need to be specified");
   }
   pplm.get("chem_integrator",chem_integrator);
   m_reactor = pele::physics::reactions::ReactorBase::create(chem_integrator);
   const int nCell = 1;
   const int reactType = 2;
   m_reactor->init(reactType, nCell);
}